

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileimagewindow.cc
# Opt level: O2

void __thiscall
bgui::FileImageWindow::onKey(FileImageWindow *this,char c,SpecialKey key,int x,int y)

{
  uint *pos;
  uint uVar1;
  uint uVar2;
  pointer pbVar3;
  int iVar4;
  ulong uVar5;
  char *spath;
  ostream *poVar6;
  bool bVar7;
  char *pcVar8;
  char *local_218 [4];
  long hp;
  long wp;
  long yp;
  long xp;
  Properties prop;
  string name;
  
  switch(key) {
  case k_left:
    if (this->current != 0) {
      this->current = this->current - 1;
LAB_00121104:
      bVar7 = false;
LAB_00121168:
      load(this,&this->current,bVar7,-1,-1,false);
    }
    break;
  case k_right:
    uVar1 = this->current;
    uVar2 = uVar1 + 1;
    this->current = uVar2;
    if ((ulong)uVar2 <
        (ulong)((long)(this->list).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->list).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5)) {
LAB_0012115f:
      bVar7 = true;
      goto LAB_00121168;
    }
    this->current = uVar1;
    break;
  default:
    goto switchD_001210c8_caseD_4;
  case k_home:
    if (this->current != 0) {
      this->current = 0;
      goto LAB_00121104;
    }
    break;
  case k_end:
    uVar5 = (long)(this->list).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->list).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    if (uVar5 != 0) {
      this->current = (int)(uVar5 >> 5) - 1;
      goto LAB_0012115f;
    }
  }
  BaseWindow::setInfoLine((BaseWindow *)this,"",true,true);
switchD_001210c8_caseD_4:
  if (c == 'c') {
    pbVar3 = (this->list).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)this->current <
        (ulong)((long)(this->list).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3 >> 5)) {
      saveContent(this,pbVar3[this->current]._M_dataplus._M_p);
    }
  }
  else if (c == 'd') {
    pbVar3 = (this->list).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)this->current <
        (ulong)((long)(this->list).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3 >> 5)) {
      pos = &this->current;
      std::__cxx11::string::string((string *)&name,(string *)(pbVar3 + this->current));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::erase(&this->list,
              (this->list).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + *pos);
      uVar2 = *pos;
      if (((ulong)uVar2 != 0) &&
         ((ulong)((long)(this->list).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->list).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5) <= (ulong)uVar2)) {
        *pos = uVar2 - 1;
      }
      load(this,pos,true,-1,-1,false);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&prop,
                     &name,".bak");
      iVar4 = rename(name._M_dataplus._M_p,(char *)prop.data._M_t._M_impl._0_8_);
      std::__cxx11::string::~string((string *)&prop);
      pcVar8 = "Cannot remove image file!";
      if (iVar4 == 0) {
        pcVar8 = "";
      }
      BaseWindow::setInfoLine((BaseWindow *)this,pcVar8,true,true);
      if ((this->list).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          (this->list).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        BaseWindow::sendClose((BaseWindow *)this);
      }
      std::__cxx11::string::~string((string *)&name);
    }
  }
  else {
    if (c == 'k') {
      if ((ulong)this->kp < 3) {
        this->kp = *(keep *)(&DAT_0014eb30 + (ulong)this->kp * 4);
      }
    }
    else {
      if (c == 'p') {
        if ((this->vc)._M_string_length != 0) {
          prop.data._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &prop.data._M_t._M_impl.super__Rb_tree_header._M_header;
          prop.data._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          prop.data._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          prop.data._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          pcVar8 = (this->list).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[this->current]._M_dataplus._M_p;
          prop.data._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               prop.data._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          spath = getenv("CVKIT_SPATH");
          gimage::loadViewProperties(&prop,pcVar8,spath,false);
          ImageWindow::visibleImagePart(&this->super_ImageWindow,&xp,&yp,&wp,&hp);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&name);
          poVar6 = std::operator<<((ostream *)&name,"\"");
          poVar6 = std::operator<<(poVar6,(string *)&this->vc);
          std::operator<<(poVar6,"\" \"");
          std::operator<<((ostream *)&name,
                          (string *)
                          ((this->list).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + this->current));
          poVar6 = std::operator<<((ostream *)&name,",x=");
          std::ostream::_M_insert<long>((long)poVar6);
          poVar6 = std::operator<<((ostream *)&name,",y=");
          std::ostream::_M_insert<long>((long)poVar6);
          poVar6 = std::operator<<((ostream *)&name,",w=");
          std::ostream::_M_insert<long>((long)poVar6);
          poVar6 = std::operator<<((ostream *)&name,",h=");
          std::ostream::_M_insert<long>((long)poVar6);
          std::operator<<((ostream *)&name,"\"");
          std::operator<<((ostream *)&name," &");
          std::__cxx11::stringbuf::str();
          poVar6 = std::operator<<((ostream *)&std::cout,(string *)local_218);
          std::endl<char,std::char_traits<char>>(poVar6);
          std::__cxx11::string::~string((string *)local_218);
          std::__cxx11::stringbuf::str();
          iVar4 = system(local_218[0]);
          std::__cxx11::string::~string((string *)local_218);
          if (iVar4 == -1) {
            poVar6 = std::operator<<((ostream *)&std::cout,"Failed!");
            std::endl<char,std::char_traits<char>>(poVar6);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)&prop);
        }
        goto LAB_00121585;
      }
      if (c != 'u') goto LAB_00121585;
      bVar7 = this->watch_file;
      this->watch_file = (bool)(bVar7 ^ 1);
      if (bVar7 == false) {
        load(this,&this->current,true,-1,-1,false);
        goto LAB_00121585;
      }
      BaseWindow::removeFileWatch((BaseWindow *)this,this->wid);
    }
    updateTitle(this);
  }
LAB_00121585:
  ImageWindow::onKey(&this->super_ImageWindow,c,key,x,y);
  return;
}

Assistant:

void FileImageWindow::onKey(char c, SpecialKey key, int x, int y)
{
  switch (key)
  {
    case k_home: /* load first image */
      if (current > 0)
      {
        current=0;
        load(current, false);
      }

      setInfoLine("");
      break;

    case k_end: /* load last image */
      if (list.size() > 0)
      {
        current=static_cast<unsigned int>(list.size()-1);
        load(current, true);
      }

      setInfoLine("");
      break;

    case k_left: /* load previous image */
      if (current > 0)
      {
        current--;
        load(current, false);
      }

      setInfoLine("");
      break;

    case k_right: /* load next image */
      current++;

      if (current < list.size())
      {
        load(current, true);
      }
      else
      {
        current--;
      }

      setInfoLine("");
      break;

    default:
      break;
  }

  switch (c)
  {
    case 'u': /* update image and toggle watch flag */
#ifdef INCLUDE_INOTIFY
      watch_file=!watch_file;

      if (watch_file)
      {
        load(current, true);
      }
      else
      {
        removeFileWatch(wid);
        updateTitle();
      }

#else
      load(current, true);
#endif
      break;

    case 'k':
      switch (kp)
      {
        case keep_none:
          kp=keep_most;
          break;

        case keep_most:
          kp=keep_all;
          break;

        case keep_all:
          kp=keep_none;
          break;
      }

      updateTitle();
      break;

    case 'c':
      if (current < list.size())
      {
        saveContent(list[current].c_str());
      }

      break;

    case 'd':
      if (current < list.size())
      {
        std::string name=list[current];

        list.erase(list.begin()+current);

        if (current > 0 && current >= list.size())
        {
          current--;
        }

        load(current, true);

        if (rename(name.c_str(), (name+".bak").c_str()) != 0)
        {
          setInfoLine("Cannot remove image file!");
        }
        else
        {
          setInfoLine("");
        }

        if (list.size() == 0)
        {
          sendClose();
        }
      }

      break;

    case 'p':
      if (vc.size() > 0)
      {
        try
        {
          gutil::Properties prop;
          gimage::loadViewProperties(prop, list[current].c_str(), getenv("CVKIT_SPATH"), false);

          long xp, yp, wp, hp;
          visibleImagePart(xp, yp, wp, hp);

          std::ostringstream out;

#ifdef WIN32
          out << "start \"plyv\" ";
#endif
          out << "\"" << vc << "\" \"";
          out << list[current];
          out << ",x=" << xp;
          out << ",y=" << yp;
          out << ",w=" << wp;
          out << ",h=" << hp;
          out << "\"";
#ifndef WIN32
          out << " &";
#endif
          std::cout << out.str() << std::endl;
		  
          if (system(out.str().c_str()) == -1)
          {
            std::cout << "Failed!" << std::endl;
          }
        }
        catch (const gutil::IOException &)
        {
          setInfoLine("Missing disparity parameter file!");
        }
      }

      break;
  }

  ImageWindow::onKey(c, key, x, y);
}